

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

char * context_name_of(char *symbolic_name)

{
  char *pcVar1;
  char *in_RDI;
  char *context_name;
  char *local_10;
  
  pcVar1 = strchr(in_RDI,0x3a);
  if (pcVar1 == (char *)0x0) {
    local_10 = (char *)string_dup("default");
  }
  else {
    local_10 = (char *)string_dup(in_RDI);
    pcVar1 = strchr(local_10,0x3a);
    *pcVar1 = '\0';
  }
  return local_10;
}

Assistant:

static char *context_name_of(const char* symbolic_name) {
    char *context_name;

    if (strchr(symbolic_name, ':')) {
        context_name = string_dup(symbolic_name);
        *strchr(context_name, ':') = '\0';
    } else {
        context_name = string_dup(CGREEN_DEFAULT_SUITE);
    }

    return context_name;
}